

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Performance::anon_unknown_1::BinaryOpCase::logSingleOperationCalculationInfo
          (BinaryOpCase *this)

{
  string *psVar1;
  int iVar2;
  size_t sVar3;
  char *__s;
  undefined1 local_190 [8];
  _func_int **local_188;
  ios_base local_118 [264];
  
  psVar1 = &this->m_op;
  iVar2 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar2 == 0) {
    __s = "addition";
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar2 == 0) {
      __s = "subtraction";
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar2 == 0) {
        __s = "multiplication";
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)psVar1);
        __s = (char *)0x0;
        if (iVar2 == 0) {
          __s = "division";
        }
      }
    }
  }
  local_190 = (undefined1  [8])
              ((this->super_OperatorPerformanceCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_188,"Note: the bigger program contains ",0x22);
  std::ostream::operator<<((ostringstream *)&local_188,0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_188," more ",6);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_188 + (int)local_188[-3]);
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_188,__s,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_188," operations in one loop iteration than the small program; ",0x3a
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_188,
             "cost of one operation is calculated as (cost_of_bigger_workload - cost_of_smaller_workload) / "
             ,0x5e);
  std::ostream::operator<<((ostringstream *)&local_188,0x10);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void BinaryOpCase::logSingleOperationCalculationInfo (void) const
{
	const int			baseNumOpsInsideLoop			= 2 * BINARY_OPERATOR_CASE_NUM_INDEPENDENT_CALCULATIONS;
	const int			numOpsInsideLoopInSmallProgram	= baseNumOpsInsideLoop * BINARY_OPERATOR_CASE_SMALL_PROGRAM_UNROLL_AMOUNT;
	const int			numOpsInsideLoopInBigProgram	= baseNumOpsInsideLoop * BINARY_OPERATOR_CASE_BIG_PROGRAM_UNROLL_AMOUNT;
	const int			opDiff							= numOpsInsideLoopInBigProgram - numOpsInsideLoopInSmallProgram;
	const char* const	opName							= m_op == "+" ? "addition"
														: m_op == "-" ? "subtraction"
														: m_op == "*" ? "multiplication"
														: m_op == "/" ? "division"
														: DE_NULL;
	DE_ASSERT(opName != DE_NULL);

	m_testCtx.getLog() << TestLog::Message << "Note: the bigger program contains " << opDiff << " more "
										   << opName << " operations in one loop iteration than the small program; "
										   << "cost of one operation is calculated as (cost_of_bigger_workload - cost_of_smaller_workload) / " << opDiff
										   << TestLog::EndMessage;
}